

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

void Wlc_NtkPrintNtk(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  char *pcVar3;
  char *pcVar4;
  Wlc_Obj_t *pObj;
  int i;
  Wlc_Ntk_t *p_local;
  
  Abc_Print(1,"PIs:");
  for (pObj._4_4_ = 0; iVar1 = Wlc_NtkPiNum(p), pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1) {
    pWVar2 = Wlc_NtkPi(p,pObj._4_4_);
    iVar1 = Wlc_ObjId(p,pWVar2);
    pcVar3 = Wlc_ObjName(p,iVar1);
    Abc_Print(1," %s",pcVar3);
  }
  Abc_Print(1,"\n\n");
  Abc_Print(1,"POs:");
  for (pObj._4_4_ = 0; iVar1 = Wlc_NtkPoNum(p), pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1) {
    pWVar2 = Wlc_NtkPo(p,pObj._4_4_);
    iVar1 = Wlc_ObjId(p,pWVar2);
    pcVar3 = Wlc_ObjName(p,iVar1);
    Abc_Print(1," %s",pcVar3);
  }
  Abc_Print(1,"\n\n");
  Abc_Print(1,"FO(Fi)s:");
  for (pObj._4_4_ = 0; iVar1 = Wlc_NtkCiNum(p), pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1) {
    pWVar2 = Wlc_NtkCi(p,pObj._4_4_);
    iVar1 = Wlc_ObjIsPi(pWVar2);
    if (iVar1 == 0) {
      iVar1 = Wlc_ObjId(p,pWVar2);
      pcVar3 = Wlc_ObjName(p,iVar1);
      pWVar2 = Wlc_ObjFo2Fi(p,pWVar2);
      iVar1 = Wlc_ObjId(p,pWVar2);
      pcVar4 = Wlc_ObjName(p,iVar1);
      Abc_Print(1," %s(%s)",pcVar3,pcVar4);
    }
  }
  Abc_Print(1,"\n\n");
  Abc_Print(1,"Objs:\n");
  for (pObj._4_4_ = 1; iVar1 = Wlc_NtkObjNumMax(p), pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1)
  {
    pWVar2 = Wlc_NtkObj(p,pObj._4_4_);
    iVar1 = Wlc_ObjIsCi(pWVar2);
    if (iVar1 == 0) {
      Wlc_NtkPrintNode(p,pWVar2);
    }
  }
  return;
}

Assistant:

void Wlc_NtkPrintNtk( Wlc_Ntk_t * p )
{
    int i;
    Wlc_Obj_t * pObj;

    Abc_Print( 1, "PIs:");
    Wlc_NtkForEachPi( p, pObj, i )
        Abc_Print( 1, " %s", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "POs:");
    Wlc_NtkForEachPo( p, pObj, i )
        Abc_Print( 1, " %s", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "FO(Fi)s:");
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !Wlc_ObjIsPi( pObj ) )
            Abc_Print( 1, " %s(%s)", Wlc_ObjName(p, Wlc_ObjId(p, pObj)), Wlc_ObjName(p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj))) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "Objs:\n");
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( !Wlc_ObjIsCi(pObj) )
           Wlc_NtkPrintNode( p, pObj ) ;
    }
}